

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

void la_miam_core_v1_data_format_text(la_vstring *vstr,void *data,int indent)

{
  byte bVar1;
  _Bool _Var2;
  void *pvVar3;
  uint in_EDX;
  la_vstring *in_RSI;
  la_vstring *in_RDI;
  char *pcVar4;
  char *hexdump;
  xmlBufferPtr xmlbufptr;
  _Bool prettify_xml;
  char *name;
  la_miam_core_v1_data_pdu *pdu;
  _Bool *in_stack_ffffffffffffffc0;
  xmlBufferPtr in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  byte in_stack_ffffffffffffffd7;
  int indent_00;
  undefined4 in_stack_ffffffffffffffe8;
  la_vstring *len;
  
  if ((in_RSI->allocated_size & 0xffff) == 0) {
    len = in_RSI;
    la_vstring_append_sprintf
              (in_RDI,"%*sPDU Length: %u\n",(ulong)in_EDX,"",(ulong)(uint)in_RSI->len);
    la_vstring_append_sprintf(in_RDI,"%*sAircraft ID: %s\n",(ulong)in_EDX,"",in_RSI + 1);
    la_vstring_append_sprintf
              (in_RDI,"%*sMsg num: %u\n",(ulong)in_EDX,"",(ulong)*(byte *)((long)&in_RSI[1].len + 7)
              );
    pcVar4 = "not ";
    if ((char)in_RSI[1].allocated_size == '\x01') {
      pcVar4 = "";
    }
    la_vstring_append_sprintf(in_RDI,"%*sACK: %srequired\n",(ulong)in_EDX,"",pcVar4);
    pvVar3 = la_dict_search(la_miam_core_v1_data_format_text::v1_compression_names,
                            (uint)*(byte *)((long)&in_RSI[1].allocated_size + 1));
    if (pvVar3 == (void *)0x0) {
      la_vstring_append_sprintf
                (in_RDI,"%*sCompression: unknown (%u)\n",(ulong)in_EDX,"",
                 (ulong)*(byte *)((long)&in_RSI[1].allocated_size + 1));
    }
    else {
      la_vstring_append_sprintf(in_RDI,"%*sCompression: %s\n",(ulong)in_EDX,"",pvVar3);
    }
    pvVar3 = la_dict_search(la_miam_core_v1_data_format_text::v1_encoding_names,
                            (uint)*(byte *)((long)&in_RSI[1].allocated_size + 2));
    if (pvVar3 == (void *)0x0) {
      la_vstring_append_sprintf
                (in_RDI,"%*sEncoding: unknown (%u)\n",(ulong)in_EDX,"",
                 (ulong)*(byte *)((long)&in_RSI[1].allocated_size + 2));
      indent_00 = (int)((ulong)pvVar3 >> 0x20);
    }
    else {
      la_vstring_append_sprintf(in_RDI,"%*sEncoding: %s\n",(ulong)in_EDX,"",pvVar3);
      indent_00 = (int)((ulong)pvVar3 >> 0x20);
    }
    bVar1 = *(byte *)((long)&in_RSI[1].allocated_size + 3);
    if (bVar1 < 3) {
      la_vstring_append_sprintf(in_RDI,"%*sACARS:\n",(ulong)in_EDX,"");
      in_EDX = in_EDX + 1;
      la_vstring_append_sprintf
                (in_RDI,"%*sLabel: %c%c",(ulong)in_EDX,"",(ulong)(uint)(int)(char)in_RSI[1].len,
                 (ulong)(uint)(int)*(char *)((long)&in_RSI[1].len + 1));
      if ((*(char *)((long)&in_RSI[1].allocated_size + 3) == '\x01') ||
         (*(char *)((long)&in_RSI[1].allocated_size + 3) == '\x02')) {
        la_vstring_append_sprintf
                  (in_RDI," Sublabel: %c%c",(ulong)(uint)(int)*(char *)((long)&in_RSI[1].len + 2),
                   (ulong)(uint)(int)*(char *)((long)&in_RSI[1].len + 3));
      }
      if (*(char *)((long)&in_RSI[1].allocated_size + 3) == '\x02') {
        la_vstring_append_sprintf
                  (in_RDI," MFI: %c%c",(ulong)(uint)(int)*(char *)((long)&in_RSI[1].len + 4),
                   (ulong)(uint)(int)*(char *)((long)&in_RSI[1].len + 5));
      }
      la_vstring_append_sprintf(in_RDI,"%s","\n");
    }
    else if (bVar1 == 3) {
      la_vstring_append_sprintf(in_RDI,"%*sNon-ACARS payload:\n",(ulong)in_EDX,"");
      in_EDX = in_EDX + 1;
      la_vstring_append_sprintf(in_RDI,"%*sApplication ID: %s\n",(ulong)in_EDX,"",&in_RSI[1].len);
    }
    if (in_RSI->str != (char *)0x0) {
      _Var2 = is_printable((uint8_t *)in_RSI->str,*(uint32_t *)((long)&in_RSI->len + 4));
      if (_Var2) {
        in_stack_ffffffffffffffd7 = 0;
        la_config_get_bool((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        if ((in_stack_ffffffffffffffd7 & 1) == 1) {
          in_stack_ffffffffffffffc8 =
               la_prettify_xml((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
          if (in_stack_ffffffffffffffc8 == (xmlBufferPtr)0x0) {
            in_stack_ffffffffffffffd7 = 0;
          }
          else {
            la_vstring_append_sprintf(in_RDI,"%*sMessage (reformatted):\n",(ulong)in_EDX,"");
            la_isprintf_multiline_text
                      (in_RSI,indent_00,
                       (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
            xmlBufferFree(in_stack_ffffffffffffffc8);
          }
        }
        if ((in_stack_ffffffffffffffd7 & 1) == 0) {
          la_vstring_append_sprintf(in_RDI,"%*sMessage:\n",(ulong)in_EDX,"");
          la_isprintf_multiline_text
                    (in_RSI,indent_00,
                     (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
        }
      }
      else {
        pcVar4 = la_hexdump((uint8_t *)in_RDI,(size_t)len);
        la_vstring_append_sprintf(in_RDI,"%*sMessage:\n",(ulong)in_EDX,"");
        la_isprintf_multiline_text
                  (in_RSI,indent_00,
                   (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
        free(pcVar4);
      }
    }
    if ((in_RSI->allocated_size & 0xffff0000) != 0) {
      la_miam_errors_format_text
                ((la_vstring *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                );
    }
  }
  else {
    la_miam_errors_format_text
              ((la_vstring *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void la_miam_core_v1_data_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);
	la_assert(indent >= 0);

	static la_dict const v1_compression_names[] = {
		{ .id = LA_MIAM_CORE_V1_COMP_NONE,      .val = "none" },
		{ .id = LA_MIAM_CORE_V1_COMP_DEFLATE,   .val = "deflate" },
		{ .id = 0x0,                            .val = NULL }
	};

	static la_dict const v1_encoding_names[] = {
		{ .id = LA_MIAM_CORE_V1_ENC_ISO5,       .val = "ISO #5" },
		{ .id = LA_MIAM_CORE_V1_ENC_BINARY,     .val = "binary" },
		{ .id = 0x0,                            .val = NULL }
	};

	la_miam_core_v1_data_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_HDR, indent);
		return;
	}
	LA_ISPRINTF(vstr, indent, "PDU Length: %u\n", pdu->pdu_len);
	LA_ISPRINTF(vstr, indent, "Aircraft ID: %s\n", pdu->aircraft_id);
	LA_ISPRINTF(vstr, indent, "Msg num: %u\n", pdu->msg_num);
	LA_ISPRINTF(vstr, indent, "ACK: %srequired\n",
			(pdu->ack_option == 1 ? "" : "not "));

	char *name = la_dict_search(v1_compression_names, pdu->compression);
	if(name != NULL) {
		LA_ISPRINTF(vstr, indent, "Compression: %s\n", name);
	} else {
		LA_ISPRINTF(vstr, indent, "Compression: unknown (%u)\n", pdu->compression);
	}

	name = la_dict_search(v1_encoding_names, pdu->encoding);
	if(name != NULL) {
		LA_ISPRINTF(vstr, indent, "Encoding: %s\n", name);
	} else {
		LA_ISPRINTF(vstr, indent, "Encoding: unknown (%u)\n", pdu->encoding);
	}

	switch(pdu->app_type) {
		case LA_MIAM_CORE_V1_APP_ACARS_2CHAR:
		case LA_MIAM_CORE_V1_APP_ACARS_4CHAR:
		case LA_MIAM_CORE_V1_APP_ACARS_6CHAR:
			LA_ISPRINTF(vstr, indent, "ACARS:\n");
			indent++;
			LA_ISPRINTF(vstr, indent, "Label: %c%c",
					pdu->app_id[0], pdu->app_id[1]);

			if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_4CHAR ||
					pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR) {
				la_vstring_append_sprintf(vstr, " Sublabel: %c%c",
						pdu->app_id[2], pdu->app_id[3]);
			}

			if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR) {
				la_vstring_append_sprintf(vstr, " MFI: %c%c",
						pdu->app_id[4], pdu->app_id[5]);
			}

			la_vstring_append_sprintf(vstr, "%s", "\n");

			break;
		case LA_MIAM_CORE_V1_APP_NONACARS_6CHAR:
			LA_ISPRINTF(vstr, indent, "Non-ACARS payload:\n");
			indent++;
			LA_ISPRINTF(vstr, indent, "Application ID: %s\n", pdu->app_id);
			break;
		default:
			break;
	}

	if(pdu->data != NULL) {
		// Don't trust pdu->encoding - if the payload is printable, then print it as text.
		// Otherwise print a hexdump.
		if(is_printable(pdu->data, pdu->data_len)) {
			// Parser has appended '\0' at the end, so it's safe to print it directly
			bool prettify_xml = false;
#ifdef WITH_LIBXML2
			(void)la_config_get_bool("prettify_xml", &prettify_xml);
			if(prettify_xml == true) {
				xmlBufferPtr xmlbufptr = NULL;
				if((xmlbufptr = la_prettify_xml((char *)pdu->data)) != NULL) {
					LA_ISPRINTF(vstr, indent, "Message (reformatted):\n");
					la_isprintf_multiline_text(vstr, indent + 1, (char *)xmlbufptr->content);
					xmlBufferFree(xmlbufptr);
				} else {
					// Doesn't look like XML - print it as normal
					prettify_xml = false;
				}
			}
#endif
			if(prettify_xml == false) {
				LA_ISPRINTF(vstr, indent, "Message:\n");
				la_isprintf_multiline_text(vstr, indent + 1, (char *)pdu->data);
			}
		} else {
			char *hexdump = la_hexdump((uint8_t *)pdu->data, pdu->data_len);
			LA_ISPRINTF(vstr, indent, "Message:\n");
			la_isprintf_multiline_text(vstr, indent + 1, hexdump);
			LA_XFREE(hexdump);
		}
	}

	if(pdu->err & LA_MIAM_ERR_BODY) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_BODY, indent + 1);
		return;
	}
}